

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::erase
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  long lVar1;
  long lVar2;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  uint row_00;
  long lVar3;
  undefined4 local_6c;
  long local_68;
  long local_60;
  SearchKey local_58;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_50;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_48;
  long *local_40;
  undefined4 *local_38;
  
  local_68 = *(long *)this;
  local_6c = *(undefined4 *)&(row->content).ptr;
  lVar2 = (long)row - local_68;
  lVar3 = lVar2 >> 2;
  local_60 = *(long *)(this + 8) - local_68 >> 2;
  local_38 = &local_6c;
  local_40 = &local_68;
  local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236bd8;
  row_00 = (uint)lVar3;
  local_50 = (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *)
             CONCAT44(local_50._4_4_,row_00);
  local_48 = this + 0x20;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),row_00,&local_58);
  local_68 = *(long *)this;
  lVar1 = *(long *)(this + 8) - local_68 >> 2;
  if (lVar1 + -1 != lVar3) {
    local_6c = *(undefined4 *)(local_68 + -4 + lVar1 * 4);
    local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236b98;
    local_48 = (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *)
               &local_68;
    local_40 = (long *)&local_6c;
    local_60 = lVar1;
    local_50 = this + 0x20;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)(lVar1 + -1),row_00,&local_58);
    *(undefined4 *)(*(long *)this + lVar2) = *(undefined4 *)(*(long *)this + -4 + lVar1 * 4);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -4;
  return;
}

Assistant:

void Table<Row, Indexes...>::erase(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  eraseImpl(&row - rows.begin());
}